

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O1

void djb::fresnel::f0_to_ior(value_type *f0,value_type *ior)

{
  float *pfVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  
  if (ior == (value_type *)0x0) {
    __assert_fail("ior && \"Null output ptr\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/demo-merl/dj_brdf.h"
                  ,0x460,
                  "void djb::fresnel::f0_to_ior(const brdf::value_type &, brdf::value_type *)");
  }
  if (0 < (int)f0->_M_size) {
    lVar2 = 0;
    do {
      pfVar1 = ior->_M_data;
      if (pfVar1 == (float *)0x0) {
        __assert_fail("ior && \"Null output ptr\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/demo-merl/dj_brdf.h"
                      ,0x454,"void djb::fresnel::f0_to_ior(float_t, float_t *)");
      }
      fVar4 = f0->_M_data[lVar2];
      fVar3 = 1.0;
      if ((fVar4 != 1.0) || (NAN(fVar4))) {
        if (fVar4 < 0.0) {
          fVar4 = sqrtf(fVar4);
        }
        else {
          fVar4 = SQRT(fVar4);
        }
        fVar3 = (fVar4 + 1.0) / (1.0 - fVar4);
      }
      pfVar1[lVar2] = fVar3;
      lVar2 = lVar2 + 1;
    } while (lVar2 < (int)f0->_M_size);
  }
  return;
}

Assistant:

void f0_to_ior(const brdf::value_type& f0, brdf::value_type *ior)
{
	DJB_ASSERT(ior && "Null output ptr");
	for (int i = 0; i < (int)f0.size(); ++i)
		f0_to_ior(f0[i], &(*ior)[i]);
}